

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O3

void sample_output<trng::mrg2>(mrg2 *r,string *name)

{
  undefined8 in_RAX;
  ostream *poVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  undefined8 uStack_38;
  
  uVar3 = name->_M_string_length;
  uStack_38 = in_RAX;
  while (uVar3 < 0x20) {
    std::__cxx11::string::push_back((char)name);
    uVar3 = name->_M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(name->_M_dataplus)._M_p,uVar3);
  iVar5 = 0xf;
  do {
    iVar2 = (r->S).r[0];
    uVar3 = (long)(r->S).r[1] * (long)(r->P).a[1] + (long)(r->P).a[0] * (long)iVar2;
    (r->S).r[1] = iVar2;
    uVar4 = (uVar3 >> 0x1f) + (uVar3 & 0x7fffffff);
    uVar3 = uVar4 - 0xfffffffe;
    if (uVar4 < 0xfffffffe) {
      uVar3 = uVar4;
    }
    iVar2 = (int)uVar3 + -0x7fffffff;
    if (uVar3 < 0x7fffffff) {
      iVar2 = (int)uVar3;
    }
    (r->S).r[0] = iVar2;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    uStack_38._0_7_ = CONCAT16(9,(undefined6)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_38 + 6),1);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  iVar5 = (r->S).r[0];
  uVar3 = (long)(r->S).r[1] * (long)(r->P).a[1] + (long)(r->P).a[0] * (long)iVar5;
  (r->S).r[1] = iVar5;
  uVar4 = (uVar3 >> 0x1f) + (uVar3 & 0x7fffffff);
  uVar3 = uVar4 - 0xfffffffe;
  if (uVar4 < 0xfffffffe) {
    uVar3 = uVar4;
  }
  iVar5 = (int)uVar3 + -0x7fffffff;
  if (uVar3 < 0x7fffffff) {
    iVar5 = (int)uVar3;
  }
  (r->S).r[0] = iVar5;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_38 + 7),1);
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}